

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  initializer_list<float> list;
  initializer_list<float> list_00;
  string local_98;
  vector<3UL> local_78;
  quaternion q2;
  quaternion q1;
  
  local_98._M_dataplus._M_p = (pointer)0x3f800000;
  local_98._M_string_length = 0;
  list._M_len = 4;
  list._M_array = (iterator)&local_98;
  blas::quaternion::quaternion(&q1,list);
  local_98._M_dataplus._M_p = (pointer)0x3f800000;
  local_98._M_string_length = 0;
  list_00._M_len = 4;
  list_00._M_array = (iterator)&local_98;
  blas::quaternion::quaternion(&q2,list_00);
  for (iVar2 = 1; iVar2 != 0x65; iVar2 = iVar2 + 1) {
    Mahony_update(&q1);
    Madgwick_update(&q2);
    blas::quaternion::to_euler_angles(&local_78,&q1);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_98,&local_78);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_98);
    blas::quaternion::to_euler_angles(&local_78,&q2);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_98,&local_78);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
    poVar1 = std::operator<<(poVar1,'\t');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)iVar2 * 0.01);
    poVar1 = std::operator<<(poVar1,'s');
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return 0;
}

Assistant:

int main() {
    int tick = 0;
    blas::quaternion q1 = {1, 0, 0, 0};
    blas::quaternion q2 = {1, 0, 0, 0};
    for (;;) {
        if (tick++ == 100) break;
        Mahony_update(q1);
        Madgwick_update(q2);
        std::cout << q1.to_euler_angles().to_string() << std::endl;
        std::cout << q2.to_euler_angles().to_string() << '\t' << tick * duration << 's' << std::endl << std::endl;
    }
}